

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O1

void test_bson_steal(void)

{
  char cVar1;
  undefined8 uVar2;
  void *pvVar3;
  bson_t *pbVar4;
  bson_t *unaff_R14;
  long unaff_R15;
  uint8_t *buf;
  bson_t dst;
  size_t len;
  bson_t stack_alloced;
  undefined1 auStack_500 [48];
  void *pvStack_4d0;
  uint8_t auStack_4c8 [72];
  bson_t abStack_480 [2];
  bson_t *pbStack_320;
  bson_t *pbStack_318;
  long lStack_310;
  code *pcStack_308;
  undefined4 *local_288;
  undefined1 local_280 [72];
  long local_238;
  undefined8 local_188;
  bson_t local_180 [2];
  
  pbVar4 = local_180;
  pcStack_308 = (code *)0x125c21;
  bson_init(pbVar4);
  pcStack_308 = (code *)0x125c3a;
  bson_append_int32(pbVar4,"a",1,1);
  pcStack_308 = (code *)0x125c4a;
  cVar1 = bson_steal(local_280,pbVar4);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x125ebc;
    test_bson_steal_cold_1();
LAB_00125ebc:
    pcStack_308 = (code *)0x125ec1;
    test_bson_steal_cold_2();
LAB_00125ec1:
    pcStack_308 = (code *)0x125ec6;
    test_bson_steal_cold_21();
LAB_00125ec6:
    pcStack_308 = (code *)0x125ecb;
    test_bson_steal_cold_20();
LAB_00125ecb:
    pcStack_308 = (code *)0x125ed0;
    test_bson_steal_cold_3();
LAB_00125ed0:
    pcStack_308 = (code *)0x125ed5;
    test_bson_steal_cold_4();
LAB_00125ed5:
    pcStack_308 = (code *)0x125eda;
    test_bson_steal_cold_5();
LAB_00125eda:
    pcStack_308 = (code *)0x125edf;
    test_bson_steal_cold_6();
LAB_00125edf:
    pcStack_308 = (code *)0x125ee4;
    test_bson_steal_cold_19();
LAB_00125ee4:
    pcStack_308 = (code *)0x125ee9;
    test_bson_steal_cold_7();
LAB_00125ee9:
    pcStack_308 = (code *)0x125eee;
    test_bson_steal_cold_8();
LAB_00125eee:
    pcStack_308 = (code *)0x125ef3;
    test_bson_steal_cold_18();
LAB_00125ef3:
    pcStack_308 = (code *)0x125ef8;
    test_bson_steal_cold_9();
LAB_00125ef8:
    pcStack_308 = (code *)0x125efd;
    test_bson_steal_cold_10();
LAB_00125efd:
    pcStack_308 = (code *)0x125f02;
    test_bson_steal_cold_11();
LAB_00125f02:
    pcStack_308 = (code *)0x125f07;
    test_bson_steal_cold_12();
LAB_00125f07:
    pcStack_308 = (code *)0x125f0c;
    test_bson_steal_cold_13();
LAB_00125f0c:
    pcStack_308 = (code *)0x125f11;
    test_bson_steal_cold_17();
LAB_00125f11:
    pcStack_308 = (code *)0x125f16;
    test_bson_steal_cold_16();
LAB_00125f16:
    pcStack_308 = (code *)0x125f1b;
    test_bson_steal_cold_14();
  }
  else {
    pcStack_308 = (code *)0x125c66;
    cVar1 = bson_has_field(local_280,"a");
    if (cVar1 == '\0') goto LAB_00125ebc;
    if ((local_280._0_4_ & 1) == 0) goto LAB_00125ec1;
    pcStack_308 = (code *)0x125c8d;
    cVar1 = bson_validate(local_180,0,0);
    if (cVar1 != '\0') goto LAB_00125ec6;
    pbVar4 = (bson_t *)local_280;
    pcStack_308 = (code *)0x125ca5;
    bson_destroy(pbVar4);
    unaff_R14 = local_180;
    pcStack_308 = (code *)0x125cb5;
    bson_init(unaff_R14);
    pcStack_308 = (code *)0x125cbd;
    bloat(unaff_R14);
    pcStack_308 = (code *)0x125ccc;
    cVar1 = bson_steal(pbVar4,unaff_R14);
    unaff_R15 = local_180[0].padding._40_8_;
    if (cVar1 == '\0') goto LAB_00125ecb;
    if (local_180[0].padding._40_8_ != local_280._48_8_) goto LAB_00125ed0;
    pcStack_308 = (code *)0x125cf6;
    cVar1 = bson_has_field(local_280,"99");
    if (cVar1 == '\0') goto LAB_00125ed5;
    if ((local_280._0_4_ & 1) != 0) goto LAB_00125eda;
    pcStack_308 = (code *)0x125d1d;
    cVar1 = bson_validate(local_180,0,0);
    if (cVar1 != '\0') goto LAB_00125edf;
    pbVar4 = (bson_t *)local_280;
    pcStack_308 = (code *)0x125d35;
    bson_destroy(pbVar4);
    pcStack_308 = (code *)0x125d3a;
    unaff_R14 = (bson_t *)bson_new();
    pcStack_308 = (code *)0x125d56;
    bson_append_int32(unaff_R14,"a",1,1);
    pcStack_308 = (code *)0x125d61;
    cVar1 = bson_steal(pbVar4,unaff_R14);
    if (cVar1 == '\0') goto LAB_00125ee4;
    pcStack_308 = (code *)0x125d7d;
    cVar1 = bson_has_field(local_280,"a");
    if (cVar1 == '\0') goto LAB_00125ee9;
    if ((local_280._0_4_ & 1) == 0) goto LAB_00125eee;
    pbVar4 = (bson_t *)local_280;
    pcStack_308 = (code *)0x125da3;
    bson_destroy(pbVar4);
    pcStack_308 = (code *)0x125da8;
    unaff_R14 = (bson_t *)bson_new();
    pcStack_308 = (code *)0x125db3;
    bloat(unaff_R14);
    unaff_R15 = *(long *)(unaff_R14->padding + 0x28);
    pcStack_308 = (code *)0x125dc2;
    cVar1 = bson_steal(pbVar4,unaff_R14);
    if (cVar1 == '\0') goto LAB_00125ef3;
    if (unaff_R15 != local_280._48_8_) goto LAB_00125ef8;
    pcStack_308 = (code *)0x125dec;
    cVar1 = bson_has_field(local_280,"99");
    if (cVar1 == '\0') goto LAB_00125efd;
    if ((local_280._0_4_ & 1) != 0) goto LAB_00125f02;
    pbVar4 = (bson_t *)local_280;
    pcStack_308 = (code *)0x125e12;
    bson_destroy(pbVar4);
    pcStack_308 = (code *)0x125e1c;
    local_288 = (undefined4 *)bson_malloc0(5);
    local_188 = 5;
    *local_288 = 5;
    pcStack_308 = (code *)0x125e47;
    uVar2 = bson_new_from_buffer(&local_288,&local_188,bson_realloc_ctx,0);
    pcStack_308 = (code *)0x125e52;
    cVar1 = bson_steal(pbVar4,uVar2);
    if (cVar1 == '\0') goto LAB_00125f07;
    if ((local_280._0_4_ & 0x20) == 0) goto LAB_00125f0c;
    if ((local_280._0_4_ & 2) == 0) goto LAB_00125f11;
    if ((code *)local_280._64_8_ != bson_realloc_ctx) goto LAB_00125f16;
    if (local_238 == 0) {
      pcStack_308 = (code *)0x125ea2;
      bson_destroy(local_280);
      pcStack_308 = (code *)0x125eac;
      bson_free(local_288);
      return;
    }
  }
  pcStack_308 = test_bson_reserve_buffer;
  test_bson_steal_cold_15();
  auStack_4c8[0x38] = '\0';
  auStack_4c8[0x39] = '\0';
  auStack_4c8[0x3a] = '\0';
  auStack_4c8[0x3b] = '\0';
  auStack_4c8[0x3c] = '\0';
  auStack_4c8[0x3d] = '\0';
  auStack_4c8[0x3e] = '\0';
  auStack_4c8[0x3f] = '\0';
  auStack_4c8[0x40] = '\0';
  auStack_4c8[0x41] = '\0';
  auStack_4c8[0x42] = '\0';
  auStack_4c8[0x43] = '\0';
  auStack_4c8[0x44] = '\0';
  auStack_4c8[0x45] = '\0';
  auStack_4c8[0x46] = '\0';
  auStack_4c8[0x47] = '\0';
  auStack_4c8[0x28] = '\0';
  auStack_4c8[0x29] = '\0';
  auStack_4c8[0x2a] = '\0';
  auStack_4c8[0x2b] = '\0';
  auStack_4c8[0x2c] = '\0';
  auStack_4c8[0x2d] = '\0';
  auStack_4c8[0x2e] = '\0';
  auStack_4c8[0x2f] = '\0';
  auStack_4c8[0x30] = '\0';
  auStack_4c8[0x31] = '\0';
  auStack_4c8[0x32] = '\0';
  auStack_4c8[0x33] = '\0';
  auStack_4c8[0x34] = '\0';
  auStack_4c8[0x35] = '\0';
  auStack_4c8[0x36] = '\0';
  auStack_4c8[0x37] = '\0';
  auStack_4c8[0x18] = '\0';
  auStack_4c8[0x19] = '\0';
  auStack_4c8[0x1a] = '\0';
  auStack_4c8[0x1b] = '\0';
  auStack_4c8[0x1c] = '\0';
  auStack_4c8[0x1d] = '\0';
  auStack_4c8[0x1e] = '\0';
  auStack_4c8[0x1f] = '\0';
  auStack_4c8[0x20] = '\0';
  auStack_4c8[0x21] = '\0';
  auStack_4c8[0x22] = '\0';
  auStack_4c8[0x23] = '\0';
  auStack_4c8[0x24] = '\0';
  auStack_4c8[0x25] = '\0';
  auStack_4c8[0x26] = '\0';
  auStack_4c8[0x27] = '\0';
  auStack_4c8[8] = '\0';
  auStack_4c8[9] = '\0';
  auStack_4c8[10] = '\0';
  auStack_4c8[0xb] = '\0';
  auStack_4c8[0xc] = '\0';
  auStack_4c8[0xd] = '\0';
  auStack_4c8[0xe] = '\0';
  auStack_4c8[0xf] = '\0';
  auStack_4c8[0x10] = '\0';
  auStack_4c8[0x11] = '\0';
  auStack_4c8[0x12] = '\0';
  auStack_4c8[0x13] = '\0';
  auStack_4c8[0x14] = '\0';
  auStack_4c8[0x15] = '\0';
  auStack_4c8[0x16] = '\0';
  auStack_4c8[0x17] = '\0';
  pvStack_4d0 = (void *)0x0;
  auStack_4c8[0] = '\0';
  auStack_4c8[1] = '\0';
  auStack_4c8[2] = '\0';
  auStack_4c8[3] = '\0';
  auStack_4c8[4] = '\0';
  auStack_4c8[5] = '\0';
  auStack_4c8[6] = '\0';
  auStack_4c8[7] = '\0';
  auStack_500[0x20] = '\0';
  auStack_500[0x21] = '\0';
  auStack_500[0x22] = '\0';
  auStack_500[0x23] = '\0';
  auStack_500[0x24] = '\0';
  auStack_500[0x25] = '\0';
  auStack_500[0x26] = '\0';
  auStack_500[0x27] = '\0';
  auStack_500[0x28] = '\0';
  auStack_500[0x29] = '\0';
  auStack_500[0x2a] = '\0';
  auStack_500[0x2b] = '\0';
  auStack_500[0x2c] = '\0';
  auStack_500[0x2d] = '\0';
  auStack_500[0x2e] = '\0';
  auStack_500[0x2f] = '\0';
  auStack_500[0x10] = '\0';
  auStack_500[0x11] = '\0';
  auStack_500[0x12] = '\0';
  auStack_500[0x13] = '\0';
  auStack_500[0x14] = '\0';
  auStack_500[0x15] = '\0';
  auStack_500[0x16] = '\0';
  auStack_500[0x17] = '\0';
  auStack_500[0x18] = '\0';
  auStack_500[0x19] = '\0';
  auStack_500[0x1a] = '\0';
  auStack_500[0x1b] = '\0';
  auStack_500[0x1c] = '\0';
  auStack_500[0x1d] = '\0';
  auStack_500[0x1e] = '\0';
  auStack_500[0x1f] = '\0';
  auStack_500._0_4_ = 3;
  auStack_500._4_4_ = 5;
  auStack_500[8] = '\x05';
  auStack_500[9] = '\0';
  auStack_500[10] = '\0';
  auStack_500[0xb] = '\0';
  auStack_500[0xc] = '\0';
  auStack_500[0xd] = '\0';
  auStack_500[0xe] = '\0';
  auStack_500[0xf] = '\0';
  pbStack_320 = pbVar4;
  pbStack_318 = unaff_R14;
  lStack_310 = unaff_R15;
  pcStack_308 = (code *)&stack0xfffffffffffffff8;
  bson_init(abStack_480);
  bson_append_utf8(auStack_500,"key",3,"value",5);
  pvVar3 = (void *)bson_reserve_buffer(abStack_480,auStack_500._4_4_);
  if (pvVar3 == (void *)0x0) {
    test_bson_reserve_buffer_cold_10();
LAB_0012618f:
    test_bson_reserve_buffer_cold_9();
LAB_00126194:
    test_bson_reserve_buffer_cold_8();
LAB_00126199:
    test_bson_reserve_buffer_cold_1();
LAB_0012619e:
    test_bson_reserve_buffer_cold_2();
LAB_001261a3:
    test_bson_reserve_buffer_cold_7();
LAB_001261a8:
    test_bson_reserve_buffer_cold_6();
LAB_001261ad:
    test_bson_reserve_buffer_cold_5();
LAB_001261b2:
    test_bson_reserve_buffer_cold_3();
  }
  else {
    if (auStack_500._4_4_ != abStack_480[0].len) goto LAB_00126281;
    if (((byte)abStack_480[0].flags & 1) == 0) goto LAB_0012618f;
    memcpy(pvVar3,auStack_500 + 8,(ulong)(uint)auStack_500._4_4_);
    BSON_ASSERT_KEY_AND_VALUE(abStack_480);
    bson_destroy(abStack_480);
    bloat((bson_t *)auStack_500);
    bson_init(abStack_480);
    pvVar3 = (void *)bson_reserve_buffer(abStack_480,auStack_500._4_4_);
    if (pvVar3 == (void *)0x0) goto LAB_00126194;
    if (auStack_500._4_4_ != abStack_480[0].len) goto LAB_00126281;
    if (((byte)abStack_480[0].flags & 1) != 0) goto LAB_00126199;
    memcpy(pvVar3,pvStack_4d0,(ulong)(uint)auStack_500._4_4_);
    BSON_ASSERT_KEY_AND_VALUE(abStack_480);
    cVar1 = bson_has_field(abStack_480,"99");
    if (cVar1 == '\0') goto LAB_0012619e;
    bson_destroy(auStack_500);
    bson_destroy(abStack_480);
    pbVar4 = (bson_t *)bson_new();
    bson_init(auStack_500);
    bson_append_utf8(auStack_500,"key",3,"value",5);
    pvVar3 = (void *)bson_reserve_buffer(pbVar4,auStack_500._4_4_);
    if (pvVar3 == (void *)0x0) goto LAB_001261a3;
    if (auStack_500._4_4_ != pbVar4->len) goto LAB_00126281;
    if ((pbVar4->flags & 1) == 0) goto LAB_001261a8;
    memcpy(pvVar3,auStack_500 + 8,(ulong)(uint)auStack_500._4_4_);
    BSON_ASSERT_KEY_AND_VALUE(pbVar4);
    bson_destroy(pbVar4);
    pbVar4 = (bson_t *)bson_new();
    bloat((bson_t *)auStack_500);
    pvVar3 = (void *)bson_reserve_buffer(pbVar4,auStack_500._4_4_);
    if (pvVar3 == (void *)0x0) goto LAB_001261ad;
    if (auStack_500._4_4_ != pbVar4->len) goto LAB_00126281;
    if ((pbVar4->flags & 1) != 0) goto LAB_001261b2;
    memcpy(pvVar3,pvStack_4d0,(ulong)(uint)auStack_500._4_4_);
    BSON_ASSERT_KEY_AND_VALUE(pbVar4);
    cVar1 = bson_has_field(pbVar4,"99");
    if (cVar1 != '\0') {
      bson_destroy(auStack_500);
      bson_destroy(pbVar4);
      return;
    }
  }
  test_bson_reserve_buffer_cold_4();
LAB_00126281:
  fprintf(_stderr,"FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n");
  abort();
}

Assistant:

static void
test_bson_steal (void)
{
   bson_t stack_alloced;
   bson_t *heap_alloced;
   bson_t dst;
   uint8_t *alloc;
   uint8_t *buf;
   size_t len;
   uint32_t len_le;

   /* inline, stack-allocated */
   bson_init (&stack_alloced);
   BSON_APPEND_INT32 (&stack_alloced, "a", 1);
   ASSERT (bson_steal (&dst, &stack_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   /* src was invalidated */
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* spilled over, stack-allocated */
   bson_init (&stack_alloced);
   bloat (&stack_alloced);
   alloc = ((bson_impl_alloc_t *) &stack_alloced)->alloc;
   ASSERT (bson_steal (&dst, &stack_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* inline, heap-allocated */
   heap_alloced = bson_new ();
   BSON_APPEND_INT32 (heap_alloced, "a", 1);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   bson_destroy (&dst);

   /* spilled over, heap-allocated */
   heap_alloced = bson_new ();
   bloat (heap_alloced);
   alloc = ((bson_impl_alloc_t *) heap_alloced)->alloc;
   ASSERT (bson_steal (&dst, heap_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   bson_destroy (&dst);

   /* test stealing from a bson created with bson_new_from_buffer */
   buf = bson_malloc0 (5);
   len = 5;
   len_le = BSON_UINT32_TO_LE (5);
   memcpy (buf, &len_le, sizeof (len_le));
   heap_alloced = bson_new_from_buffer (&buf, &len, bson_realloc_ctx, NULL);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (dst.flags & BSON_FLAG_NO_FREE);
   ASSERT (dst.flags & BSON_FLAG_STATIC);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc == bson_realloc_ctx);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc_func_ctx == NULL);
   bson_destroy (&dst);
   bson_free (buf);
}